

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

void __thiscall testing::internal::Arguments::AddArgument(Arguments *this,char *argument)

{
  pointer ppcVar1;
  char *local_18;
  
  ppcVar1 = (this->args_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_18 = strdup(argument);
  std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
            (&this->args_,(const_iterator)(ppcVar1 + -1),&local_18);
  return;
}

Assistant:

void AddArgument(const char* argument) {
    args_.insert(args_.end() - 1, posix::StrDup(argument));
  }